

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

bool __thiscall
ViconCGStreamIO::VBuffer::
Read<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (VBuffer *this,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *o_rValues)

{
  map<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
  *this_00;
  bool bVar1;
  pair<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_a8;
  uint local_70;
  undefined1 local_60 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> Value;
  uint local_28;
  uint Key;
  UInt32 Index;
  UInt32 Size;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *o_rValues_local;
  VBuffer *this_local;
  
  _Index = (map<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
            *)o_rValues;
  o_rValues_local =
       (map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
        *)this;
  std::
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::clear(o_rValues);
  Key = 0;
  bVar1 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,&Key);
  if (bVar1) {
    for (local_28 = 0; local_28 != Key; local_28 = local_28 + 1) {
      bVar1 = Read<unsigned_int>(this,(uint *)((long)&Value._M_t._M_impl.super__Rb_tree_header.
                                                      _M_node_count + 4));
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_001534be;
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_60);
      bVar1 = Read<unsigned_int>(this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)local_60);
      this_00 = _Index;
      if (bVar1) {
        std::
        make_pair<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>&>
                  (&local_a8,
                   (uint *)((long)&Value._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_60);
        std::
        map<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
        ::
        insert<std::pair<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                  (this_00,&local_a8);
        std::
        pair<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
        ::~pair(&local_a8);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_70 = (uint)!bVar1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_60);
      if (local_70 != 0) goto LAB_001534be;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001534be:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Read( std::map< K, V > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    for( ViconCGStreamType::UInt32 Index = 0; Index != Size; ++Index )
    {
      K Key;
      if( !Read( Key ) )
      {
        return false;
      }
      V Value;
      if( !Read( Value ) )
      {
        return false;
      }
      o_rValues.insert( std::make_pair( Key, Value ) );
    }
    return true;
  }